

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

ON_SHA1_Hash *
ON_SHA1_Hash::FromString
          (ON_SHA1_Hash *__return_storage_ptr__,ON_wString string_to_parse,bool bParseLeasingSpaces,
          bool bParseInteriorSpace,bool bParseInteriorHyphen,ON_SHA1_Hash failure_return_value)

{
  wchar_t wVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  uint uVar11;
  wchar_t *pwVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  wchar_t *pwVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  short sVar20;
  undefined1 auVar23 [16];
  uint local_d8 [42];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar21;
  undefined6 uVar22;
  
  pwVar12 = ON_wString::operator_cast_to_wchar_t_(string_to_parse.m_s);
  if (pwVar12 == (wchar_t *)0x0) {
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) = failure_return_value.m_digest._16_4_;
  }
  else {
    uVar19 = 0;
    memset(local_d8,0,0xa0);
    uVar11 = ON_wString::Length((ON_wString *)string_to_parse.m_s);
    if (0 < (int)uVar11) {
      pwVar16 = (wchar_t *)0x0;
      uVar15 = 0;
      do {
        uVar14 = uVar15;
        wVar1 = pwVar12[uVar14];
        uVar17 = wVar1 + L'\xffffffd0';
        iVar18 = (int)uVar19;
        if (uVar17 < 10) {
LAB_005ad420:
          local_d8[uVar19] = uVar17;
          uVar19 = (ulong)(iVar18 + 1);
        }
        else {
          if ((uint)(wVar1 + L'\xffffffbf') < 6) {
            uVar17 = wVar1 + L'\xffffffc9';
            goto LAB_005ad420;
          }
          if ((uint)(wVar1 + L'\xffffff9f') < 6) {
            uVar17 = wVar1 + L'\xffffffa9';
            goto LAB_005ad420;
          }
          if (wVar1 == L'-') {
            if (iVar18 == 0 || !bParseInteriorHyphen) goto LAB_005ad4a1;
LAB_005ad472:
            bVar10 = pwVar16 == pwVar12 + -1;
            pwVar16 = pwVar12;
            if (bVar10) goto LAB_005ad4a1;
          }
          else {
            if (wVar1 != L' ') goto LAB_005ad4a1;
            if (!bParseLeasingSpaces || iVar18 != 0) {
              if (iVar18 != 0 && bParseInteriorSpace) goto LAB_005ad472;
              goto LAB_005ad4a1;
            }
            uVar19 = 0;
          }
        }
        uVar15 = uVar14 + 1;
      } while ((uVar15 < uVar11) && ((uint)uVar19 < 0x28));
      if (((int)uVar14 < (int)uVar11 && (uint)uVar19 == 0x28) &&
         ((uVar11 <= uVar15 || (bVar10 = ON_wString::IsHexDigit(pwVar12[uVar15]), !bVar10)))) {
        ON_SHA1_Hash(__return_storage_ptr__);
        auVar9 = _DAT_006cc290;
        lVar13 = 0;
        do {
          auVar23._0_4_ = local_d8[lVar13 * 2] * 0x10 + local_d8[lVar13 * 2 + 1];
          auVar23._4_4_ = local_d8[lVar13 * 2 + 2] * 0x10 + local_d8[lVar13 * 2 + 3];
          auVar23._8_4_ = local_d8[lVar13 * 2 + 4] * 0x10 + local_d8[lVar13 * 2 + 5];
          auVar23._12_4_ = local_d8[lVar13 * 2 + 6] * 0x10 + local_d8[lVar13 * 2 + 7];
          auVar23 = auVar23 & auVar9;
          sVar6 = auVar23._0_2_;
          cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar23[0] - (0xff < sVar6);
          sVar6 = auVar23._2_2_;
          sVar20 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar23[2] - (0xff < sVar6),cVar2);
          sVar6 = auVar23._4_2_;
          cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar23[4] - (0xff < sVar6);
          sVar6 = auVar23._6_2_;
          uVar21 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar23[6] - (0xff < sVar6),
                            CONCAT12(cVar3,sVar20));
          sVar6 = auVar23._8_2_;
          cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar23[8] - (0xff < sVar6);
          sVar6 = auVar23._10_2_;
          uVar22 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar23[10] - (0xff < sVar6),
                            CONCAT14(cVar4,uVar21));
          sVar6 = auVar23._12_2_;
          cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar23[0xc] - (0xff < sVar6);
          sVar8 = auVar23._14_2_;
          sVar6 = (short)((uint)uVar21 >> 0x10);
          sVar7 = (short)((uint6)uVar22 >> 0x20);
          sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar23[0xe] - (0xff < sVar8),
                                   CONCAT16(cVar5,uVar22)) >> 0x30);
          *(uint *)(__return_storage_ptr__->m_digest + lVar13) =
               CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                        CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                 CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                          (0 < sVar20) * (sVar20 < 0x100) * cVar2 - (0xff < sVar20))
                                ));
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0x14);
        return __return_storage_ptr__;
      }
    }
LAB_005ad4a1:
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) = failure_return_value.m_digest._16_4_;
  }
  *(undefined8 *)__return_storage_ptr__->m_digest = failure_return_value.m_digest._0_8_;
  *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = failure_return_value.m_digest._8_8_;
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SHA1_Hash::FromString(
  const ON_wString string_to_parse,
  bool bParseLeasingSpaces,
  bool bParseInteriorSpace,
  bool bParseInteriorHyphen,
  ON_SHA1_Hash failure_return_value
)
{
  const wchar_t* s = static_cast<const wchar_t*>(string_to_parse);
  if (nullptr == s)
    return failure_return_value;

  unsigned digit_count = 0;
  int digits[40] = {};
  const wchar_t* skipped = nullptr;
  const int len = string_to_parse.Length();
  int sdex = 0;
  for (/* empty init */; sdex < len && digit_count < 40; ++sdex)
  {
    const int c = (int)s[sdex];
    if (c >= '0' && c <= '9')
    {
      digits[digit_count++] = (c - '0');
    }
    else if (c >= 'A' && c <= 'F')
    {
      digits[digit_count++] = (c - 'A') + 10;
    }
    else if (c >= 'a' && c <= 'f')
    {
      digits[digit_count++] = (c - 'a') + 10;
    }
    else  if ((int)(ON_wString::Space) == c)
    {
      if (bParseLeasingSpaces && 0 == digit_count)
        continue; // skip leading white space

      if (bParseInteriorSpace && digit_count > 0 && skipped != s - 1)
        skipped = s;
      else
        break;
    }
    else  if ((int)(ON_wString::HyphenMinus) == c)
    {
      if (bParseInteriorHyphen && digit_count > 0 && skipped != s - 1)
        skipped = s;
      else
        break;
    }
    else
      break;
  }

  if (40 != digit_count || sdex > len || (sdex < len && true == ON_wString::IsHexDigit(s[sdex])))
    return failure_return_value;

  ON_SHA1_Hash h;
  int i = 0;
  for(int j = 0; j < 20; ++j, ++i, ++i)
    h.m_digest[j] = (ON__UINT8)(16 * digits[i] + digits[i + 1]);
  return h;
}